

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.h
# Opt level: O3

bool __thiscall
pbrt::BasicTextureEvaluator::CanEvaluate
          (BasicTextureEvaluator *this,initializer_list<pbrt::FloatTextureHandle> ftex,
          initializer_list<pbrt::SpectrumTextureHandle> stex)

{
  long lVar1;
  ulong uVar2;
  ushort uVar3;
  
  if (ftex._M_len != 0) {
    lVar1 = 0;
    do {
      uVar2 = *(ulong *)((long)&((ftex._M_array)->
                                super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
                                ).bits + lVar1);
      if ((((uVar2 & 0xffffffffffff) != 0) &&
          (uVar2 = uVar2 & 0xffff000000000000, uVar2 != 0x5000000000000)) &&
         (uVar2 != 0x2000000000000)) {
        return false;
      }
      lVar1 = lVar1 + 8;
    } while (ftex._M_len * 8 != lVar1);
  }
  if (stex._M_len != 0) {
    lVar1 = 0;
    do {
      uVar2 = *(ulong *)((long)&((stex._M_array)->
                                super_TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
                                ).bits + lVar1);
      if ((uVar2 & 0xffffffffffff) != 0) {
        uVar3 = (ushort)(uVar2 - 0x1000000000000 >> 0x30);
        if (6 < uVar3) {
          return false;
        }
        if ((0x4bU >> (uVar3 & 0x1f) & 1) == 0) {
          return false;
        }
      }
      lVar1 = lVar1 + 8;
    } while (stex._M_len * 8 != lVar1);
  }
  return true;
}

Assistant:

PBRT_CPU_GPU
    bool CanEvaluate(std::initializer_list<FloatTextureHandle> ftex,
                     std::initializer_list<SpectrumTextureHandle> stex) const {
        for (auto f : ftex)
            if (f && (!f.Is<FloatConstantTexture>() && !f.Is<GPUFloatImageTexture>())) {
                return false;
            }
        for (auto s : stex)
            if (s && (!s.Is<SpectrumConstantTexture>() && !s.Is<RGBConstantTexture>() &&
                      !s.Is<RGBReflectanceConstantTexture>() &&
                      !s.Is<GPUSpectrumImageTexture>())) {
                return false;
            }
        return true;
    }